

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::scrollContentsBy(QTreeView *this,int dx,int dy)

{
  bool bVar1;
  int iVar2;
  ScrollMode SVar3;
  int iVar4;
  int iVar5;
  QTreeViewPrivate *pQVar6;
  QHeaderViewPrivate *this_00;
  Promoted<long_long,_int> PVar7;
  qsizetype qVar8;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int previousViewIndex;
  int currentViewIndex;
  int previousScrollbarValue;
  int currentScrollbarValue;
  int itemHeight;
  int newOffset;
  int oldOffset;
  QTreeViewPrivate *d;
  int maxDeltaY;
  int viewCount;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff60;
  ScrollMode in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar9;
  int in_stack_ffffffffffffff7c;
  int local_6c;
  int local_5c;
  int local_58;
  qsizetype local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  pQVar6 = d_func((QTreeView *)0x8fde51);
  QBasicTimer::stop();
  bVar1 = QWidget::isRightToLeft((QWidget *)0x8fde71);
  local_6c = in_ESI;
  if (bVar1) {
    local_6c = -in_ESI;
  }
  if (local_6c != 0) {
    iVar2 = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff60);
    this_00 = QHeaderView::d_func((QHeaderView *)0x8fdec4);
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
    QAbstractItemView::horizontalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff60);
    QHeaderViewPrivate::setScrollOffset
              (this_00,(QScrollBar *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74);
    SVar3 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff60);
    if (SVar3 == ScrollPerItem) {
      in_stack_ffffffffffffff7c = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff60);
      bVar1 = QWidget::isRightToLeft((QWidget *)0x8fdf21);
      if (bVar1) {
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c - iVar2;
      }
      else {
        in_stack_ffffffffffffff7c = iVar2 - in_stack_ffffffffffffff7c;
      }
    }
  }
  if (pQVar6->defaultItemHeight < 1) {
    iVar2 = (**(code **)(*in_RDI + 0x1f8))(in_RDI,0);
  }
  else {
    iVar2 = pQVar6->defaultItemHeight;
  }
  iVar9 = iVar2;
  bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8fdf97);
  if ((!bVar1) && (iVar2 != 0)) {
    local_10 = QWidget::height((QWidget *)0x8fdfb8);
    local_10 = local_10 / iVar2;
    local_20 = QList<QTreeViewItem>::size(&pQVar6->viewItems);
    PVar7 = qMin<long_long,int>(&local_20,&local_10);
    local_14 = (int)PVar7;
    iVar2 = qAbs<int>(&local_c);
    iVar4 = qAbs<int>(&local_14);
    if ((iVar4 < iVar2) &&
       (bVar1 = QHash<QWidget_*,_QPersistentModelIndex>::isEmpty
                          (&(pQVar6->super_QAbstractItemViewPrivate).editorIndexHash), bVar1)) {
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    else {
      if ((local_c != 0) &&
         (SVar3 = QAbstractItemView::verticalScrollMode
                            ((QAbstractItemView *)in_stack_ffffffffffffff60), SVar3 == ScrollPerItem
         )) {
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
        iVar4 = QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff60);
        local_58 = iVar4 + local_c;
        local_c = 0;
        if (local_58 < iVar4) {
          for (; local_58 < iVar4; local_58 = local_58 + 1) {
            qVar8 = QList<QTreeViewItem>::size(&pQVar6->viewItems);
            if (local_58 < qVar8) {
              iVar5 = QTreeViewPrivate::itemHeight
                                ((QTreeViewPrivate *)CONCAT44(in_stack_ffffffffffffff7c,iVar9),iVar2
                                );
              local_c = local_c - iVar5;
            }
          }
        }
        else if (iVar4 < local_58) {
          while (local_5c = local_58 + -1, iVar4 <= local_5c) {
            in_stack_ffffffffffffff60 = (QAbstractItemViewPrivate *)(long)local_5c;
            qVar8 = QList<QTreeViewItem>::size(&pQVar6->viewItems);
            local_58 = local_5c;
            if ((long)in_stack_ffffffffffffff60 < qVar8) {
              iVar5 = QTreeViewPrivate::itemHeight
                                ((QTreeViewPrivate *)CONCAT44(in_stack_ffffffffffffff7c,iVar9),iVar2
                                );
              local_c = iVar5 + local_c;
            }
          }
        }
      }
      QAbstractItemViewPrivate::scrollContentsBy
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::scrollContentsBy(int dx, int dy)
{
    Q_D(QTreeView);

    d->delayedAutoScroll.stop(); // auto scroll was canceled by the user scrolling

    dx = isRightToLeft() ? -dx : dx;
    if (dx) {
        int oldOffset = d->header->offset();
        d->header->d_func()->setScrollOffset(horizontalScrollBar(), horizontalScrollMode());
        if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->header->offset();
            dx = isRightToLeft() ? newOffset - oldOffset : oldOffset - newOffset;
        }
    }

    const int itemHeight = d->defaultItemHeight <= 0 ? sizeHintForRow(0) : d->defaultItemHeight;
    if (d->viewItems.isEmpty() || itemHeight == 0)
        return;

    // guestimate the number of items in the viewport
    int viewCount = d->viewport->height() / itemHeight;
    int maxDeltaY = qMin(d->viewItems.size(), viewCount);
    // no need to do a lot of work if we are going to redraw the whole thing anyway
    if (qAbs(dy) > qAbs(maxDeltaY) && d->editorIndexHash.isEmpty()) {
        verticalScrollBar()->update();
        d->viewport->update();
        return;
    }

    if (dy && verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int currentScrollbarValue = verticalScrollBar()->value();
        int previousScrollbarValue = currentScrollbarValue + dy; // -(-dy)
        int currentViewIndex = currentScrollbarValue; // the first visible item
        int previousViewIndex = previousScrollbarValue;
        dy = 0;
        if (previousViewIndex < currentViewIndex) { // scrolling down
            for (int i = previousViewIndex; i < currentViewIndex; ++i) {
                if (i < d->viewItems.size())
                    dy -= d->itemHeight(i);
            }
        } else if (previousViewIndex > currentViewIndex) { // scrolling up
            for (int i = previousViewIndex - 1; i >= currentViewIndex; --i) {
                if (i < d->viewItems.size())
                    dy += d->itemHeight(i);
            }
        }
    }

    d->scrollContentsBy(dx, dy);
}